

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

void __thiscall
StunMsg_RFC5769SampleIPv4Response_Test::~StunMsg_RFC5769SampleIPv4Response_Test
          (StunMsg_RFC5769SampleIPv4Response_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV4)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr*)&ipv4);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}